

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

int mfprintf(mFILE *mf,char *fmt,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  char *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 0x10;
  local_108.fp_offset = 0x30;
  local_108.reg_save_area = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vflen(fmt,&local_108);
  uVar3 = mf->alloced;
  if (uVar3 < mf->offset + (long)iVar1) {
    __ptr = mf->data;
    do {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 * 2;
      if (bVar4) {
        uVar3 = 0x400;
      }
      __ptr = (char *)realloc(__ptr,uVar3);
      if (__ptr == (char *)0x0) {
        return -1;
      }
      mf->alloced = uVar3;
      mf->data = __ptr;
    } while (uVar3 < mf->offset + (long)iVar1);
  }
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 0x10;
  local_108.fp_offset = 0x30;
  local_108.reg_save_area = local_e8;
  uVar2 = vsprintf(mf->data + mf->offset,fmt,&local_108);
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2 + mf->offset;
    mf->offset = uVar3;
    if (mf->size < uVar3) {
      mf->size = uVar3;
    }
  }
  if ((mf->fp == _stderr) && (iVar1 = mfflush(mf), iVar1 != 0)) {
    return -1;
  }
  return uVar2;
}

Assistant:

int mfprintf(mFILE *mf, char *fmt, ...) {
    int ret;
    size_t est_length;
    va_list args;

    va_start(args, fmt);
    est_length = vflen(fmt, args);
    va_end(args);
    while (est_length + mf->offset > mf->alloced) {
	size_t new_alloced = mf->alloced ? mf->alloced * 2 : 1024;
	void * new_data    = realloc(mf->data, new_alloced);
	if (NULL == new_data) return -1;
	mf->alloced = new_alloced;
	mf->data    = new_data;
    }

    va_start(args, fmt);
    ret = vsprintf(&mf->data[mf->offset], fmt, args);
    va_end(args);

    if (ret > 0) {
	mf->offset += ret;
	if (mf->size < mf->offset)
	    mf->size = mf->offset;
    }

    if (mf->fp == stderr) {
	/* Auto-flush for stderr */
	if (0 != mfflush(mf)) return -1;
    }

    return ret;
}